

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfCRgbaFile.cpp
# Opt level: O0

int ImfHeaderV2iAttribute(ImfHeader *hdr,char *name,int *x,int *y)

{
  TypedAttribute<Imath_3_2::Vec2<int>_> *this;
  Vec2<int> *pVVar1;
  int *in_RCX;
  int *in_RDX;
  ImfHeader *in_RDI;
  exception *e;
  V2i *v;
  char *in_stack_ffffffffffffffc8;
  Header *in_stack_ffffffffffffffd0;
  
  anon_unknown.dwarf_70604::header(in_RDI);
  this = Imf_3_4::Header::typedAttribute<Imf_3_4::TypedAttribute<Imath_3_2::Vec2<int>>>
                   (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  pVVar1 = Imf_3_4::TypedAttribute<Imath_3_2::Vec2<int>_>::value(this);
  *in_RDX = pVVar1->x;
  *in_RCX = pVVar1->y;
  return 1;
}

Assistant:

int
ImfHeaderV2iAttribute (const ImfHeader* hdr, const char name[], int* x, int* y)
{
    try
    {
        const V2i& v =
            header (hdr)
                ->typedAttribute<OPENEXR_IMF_INTERNAL_NAMESPACE::V2iAttribute> (
                    name)
                .value ();

        *x = v.x;
        *y = v.y;

        return 1;
    }
    catch (const std::exception& e)
    {
        setErrorMessage (e);
        return 0;
    }
}